

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  Byte BVar1;
  char cVar2;
  SRes SVar3;
  int iVar4;
  int iVar5;
  UInt64 *pUVar6;
  size_t *psVar7;
  UInt32 *pUVar8;
  Byte *pBVar9;
  ulong uVar10;
  CSzAr *alloc_00;
  Byte *pBVar11;
  byte *pbVar12;
  CSzData *pCVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  UInt32 UVar19;
  CSzData *pCVar20;
  byte bVar21;
  uint uVar22;
  UInt32 UVar23;
  CSzAr *pCVar24;
  uint uVar25;
  UInt64 UVar26;
  _func_void_ptr_void_ptr_size_t *__n;
  bool bVar27;
  UInt32 index_1;
  UInt64 type;
  UInt32 numCoders;
  UInt32 numFolders;
  UInt64 packSize;
  UInt32 coderOutStreams;
  UInt32 local_124;
  CSzData local_118;
  CSzData *local_100;
  CSzData *local_f8;
  uint local_f0;
  UInt32 local_ec;
  UInt64 local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  CSzData *local_d0;
  UInt64 local_c8 [9];
  byte *local_80;
  uint local_78 [18];
  
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  SVar3 = ReadNumber(sd,&local_e8);
  if (SVar3 != 0) {
    return SVar3;
  }
  if (local_e8 == 6) {
    SVar3 = ReadNumber(sd,dataOffset);
    if (SVar3 != 0) {
      return SVar3;
    }
    SVar3 = SzReadNumber32(sd,&p->NumPackStreams);
    if (SVar3 != 0) {
      return SVar3;
    }
    SVar3 = WaitId(sd,9);
    if (SVar3 != 0) {
      return SVar3;
    }
    pUVar6 = (UInt64 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)p->NumPackStreams * 8 + 8);
    p->PackPositions = pUVar6;
    if (pUVar6 != (UInt64 *)0x0) {
      uVar10 = (ulong)p->NumPackStreams;
      if (uVar10 == 0) {
        uVar10 = 0;
        UVar26 = 0;
      }
      else {
        uVar16 = 0;
        UVar26 = 0;
        local_f8 = sd;
        do {
          p->PackPositions[uVar16] = UVar26;
          SVar3 = ReadNumber(local_f8,local_c8);
          if (SVar3 != 0) {
            return SVar3;
          }
          bVar27 = CARRY8(UVar26,local_c8[0]);
          UVar26 = UVar26 + local_c8[0];
          if (bVar27) {
            return 0x10;
          }
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
        pUVar6 = p->PackPositions;
        sd = local_f8;
      }
      pUVar6[uVar10] = UVar26;
      SVar3 = ReadNumber(sd,local_c8);
      if (SVar3 != 0) {
        return SVar3;
      }
      do {
        if (local_c8[0] == 10) {
          iVar4 = SkipBitUi32s(sd,p->NumPackStreams);
        }
        else {
          if (local_c8[0] == 0) {
            SVar3 = ReadNumber(sd,&local_e8);
            if (SVar3 != 0) {
              return SVar3;
            }
            goto LAB_0010ee20;
          }
          iVar4 = SkipData(sd);
        }
        if (iVar4 != 0) {
          return iVar4;
        }
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
      } while( true );
    }
  }
  else {
LAB_0010ee20:
    if (local_e8 != 7) {
LAB_0010f4b3:
      if (local_e8 != 8) {
        ssi->NumTotalSubStreams = p->NumFolders;
LAB_0010f607:
        return (uint)(local_e8 != 0) << 2;
      }
      local_100 = &ssi->sdNumSubStreams;
      local_c8[0] = 0;
      UVar23 = p->NumFolders;
      iVar4 = 0;
      local_f8 = (CSzData *)CONCAT44(local_f8._4_4_,UVar23);
      local_124 = 0;
      while( true ) {
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
        if ((local_c8[0] - 9 < 2) || (local_c8[0] == 0)) break;
        if (local_c8[0] == 0xd) {
          pBVar9 = sd->Data;
          local_100->Data = pBVar9;
          if ((UInt32)local_f8 == 0) {
            UVar23 = 0;
            local_124 = 0;
            pBVar11 = pBVar9;
          }
          else {
            local_124 = 0;
            UVar23 = 0;
            uVar25 = 0;
            do {
              SVar3 = SzReadNumber32(sd,local_78);
              if (SVar3 != 0) {
                return SVar3;
              }
              bVar27 = CARRY4(UVar23,local_78[0]);
              UVar23 = UVar23 + local_78[0];
              if (bVar27) {
                return 4;
              }
              iVar5 = local_78[0] - 1;
              bVar27 = iVar5 != 0;
              if (local_78[0] == 0) {
                iVar5 = 0;
              }
              if (((bVar27) || (pBVar9 = (p->FolderCRCs).Defs, pBVar9 == (Byte *)0x0)) ||
                 (-1 < (char)(pBVar9[uVar25 >> 3] << ((byte)uVar25 & 7)))) {
                local_124 = local_124 + local_78[0];
              }
              iVar4 = iVar4 + iVar5;
              uVar25 = uVar25 + 1;
            } while ((UInt32)local_f8 != uVar25);
            pBVar9 = local_100->Data;
            pBVar11 = sd->Data;
          }
          (ssi->sdNumSubStreams).Size = (long)pBVar11 - (long)pBVar9;
        }
        else {
          SVar3 = SkipData(sd);
          if (SVar3 != 0) {
            return SVar3;
          }
        }
      }
      if ((local_100->Data == (Byte *)0x0) &&
         (pbVar12 = (p->FolderCRCs).Defs, local_124 = (UInt32)local_f8, pbVar12 != (byte *)0x0)) {
        iVar5 = 0;
        if ((UInt32)local_f8 != 0) {
          uVar25 = 0;
          bVar21 = 0;
          UVar19 = (UInt32)local_f8;
          do {
            if (uVar25 == 0) {
              bVar21 = *pbVar12;
              pbVar12 = pbVar12 + 1;
              uVar25 = 8;
            }
            uVar25 = uVar25 - 1;
            iVar5 = iVar5 + (uint)((bVar21 >> (uVar25 & 0x1f) & 1) != 0);
            UVar19 = UVar19 - 1;
          } while (UVar19 != 0);
        }
        local_124 = (UInt32)local_f8 - iVar5;
      }
      ssi->NumTotalSubStreams = UVar23;
      ssi->NumSubDigests = local_124;
      if (local_c8[0] == 9) {
        pbVar12 = sd->Data;
        (ssi->sdSizes).Data = pbVar12;
        uVar10 = sd->Size;
        for (; iVar4 != 0; iVar4 = iVar4 + -1) {
          if (uVar10 == 0) {
            return 0x10;
          }
          uVar16 = uVar10 - 1;
          pbVar14 = pbVar12 + 1;
          bVar21 = *pbVar12;
          if ((char)bVar21 < '\0') {
            if ((bVar21 & 0x40) == 0) {
              if (uVar16 == 0) {
                return 0x10;
              }
              uVar16 = uVar10 - 2;
              pbVar14 = pbVar12 + 2;
            }
            else {
              uVar10 = 2;
              if ((bVar21 & 0x20) != 0) {
                uVar25 = 0x20;
                uVar15 = uVar10;
                do {
                  uVar10 = uVar15 + 1;
                  if (6 < (uint)uVar15) break;
                  uVar25 = uVar25 >> 1;
                  uVar15 = uVar10;
                } while ((uVar25 & bVar21) != 0);
              }
              bVar27 = uVar16 < uVar10;
              uVar16 = uVar16 - uVar10;
              if (bVar27) {
                return 0x10;
              }
              pbVar14 = pbVar14 + uVar10;
            }
          }
          pbVar12 = pbVar14;
          uVar10 = uVar16;
        }
        sd->Data = pbVar12;
        sd->Size = uVar10;
        (ssi->sdSizes).Size = (long)pbVar12 - (long)(ssi->sdSizes).Data;
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
      }
      do {
        if (local_c8[0] == 10) {
          (ssi->sdCRCs).Data = sd->Data;
          SVar3 = SkipBitUi32s(sd,local_124);
          if (SVar3 != 0) {
            return SVar3;
          }
          (ssi->sdCRCs).Size = (long)sd->Data - (long)(ssi->sdCRCs).Data;
        }
        else {
          if (local_c8[0] == 0) {
            SVar3 = ReadNumber(sd,&local_e8);
            if (SVar3 != 0) {
              return SVar3;
            }
            goto LAB_0010f607;
          }
          SVar3 = SkipData(sd);
          if (SVar3 != 0) {
            return SVar3;
          }
        }
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
      } while( true );
    }
    SVar3 = WaitId(sd,0xb);
    if (SVar3 != 0) {
      return SVar3;
    }
    SVar3 = SzReadNumber32(sd,&local_d4);
    if (SVar3 != 0) {
      return SVar3;
    }
    local_f8 = (CSzData *)(ulong)local_d4;
    if (numFoldersMax < local_d4) {
      return 4;
    }
    p->NumFolders = local_d4;
    if (sd->Size == 0) {
      return 0x10;
    }
    sd->Size = sd->Size - 1;
    pBVar9 = sd->Data;
    sd->Data = pBVar9 + 1;
    BVar1 = *pBVar9;
    if (BVar1 == '\0') {
      local_118.Data = sd->Data;
      local_118.Size = sd->Size;
    }
    else {
      SVar3 = SzReadNumber32(sd,(UInt32 *)local_c8);
      if (SVar3 != 0) {
        return SVar3;
      }
      if (numTempBufs <= (uint)local_c8[0]) {
        return 0x10;
      }
      local_118.Data = tempBufs[local_c8[0] & 0xffffffff].data;
      local_118.Size = tempBufs[local_c8[0] & 0xffffffff].size;
    }
    pCVar20 = local_f8;
    psVar7 = (size_t *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(long)local_f8 * 8 + 8);
    p->FoCodersOffsets = psVar7;
    if (psVar7 != (size_t *)0x0) {
      sVar17 = (long)pCVar20 * 4 + 4;
      pUVar8 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar17);
      p->FoStartPackStreamIndex = pUVar8;
      if (pUVar8 != (UInt32 *)0x0) {
        pUVar8 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar17);
        pCVar20 = local_f8;
        p->FoToCoderUnpackSizes = pUVar8;
        if (pUVar8 != (UInt32 *)0x0) {
          pBVar9 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)local_f8);
          p->FoToMainUnpackSizeIndex = pBVar9;
          if (pBVar9 != (Byte *)0x0) {
            if ((int)pCVar20 == 0) {
              uVar25 = 0;
              pbVar12 = local_118.Data;
              UVar23 = 0;
            }
            else {
              pCVar13 = (CSzData *)0x0;
              local_dc = 0;
              local_ec = 0;
              local_80 = local_118.Data;
              do {
                p->FoCodersOffsets[(long)pCVar13] = (long)local_118.Data - (long)local_80;
                local_d0 = pCVar13;
                SVar3 = SzReadNumber32(&local_118,&local_d8);
                if (SVar3 != 0) {
                  return SVar3;
                }
                local_100 = (CSzData *)(ulong)local_d8;
                if (local_d8 - 0x41 < 0xffffffc0) {
                  return 4;
                }
                uVar22 = 0;
                uVar25 = local_d8;
                do {
                  if (local_118.Size == 0) {
                    return 0x10;
                  }
                  bVar21 = *local_118.Data;
                  if ((0x3f < bVar21) || (uVar18 = bVar21 & 0xf, uVar10 = (ulong)uVar18, 8 < uVar18)
                     ) {
                    return 4;
                  }
                  uVar16 = local_118.Size - 1;
                  local_118.Size = uVar16 - uVar10;
                  if (uVar16 < uVar10) {
                    return 0x10;
                  }
                  local_118.Data = local_118.Data + uVar10 + 1;
                  local_c8[0] = CONCAT44(local_c8[0]._4_4_,1);
                  uVar18 = 1;
                  if ((bVar21 & 0x10) != 0) {
                    SVar3 = SzReadNumber32(&local_118,(UInt32 *)local_c8);
                    if (SVar3 != 0) {
                      return SVar3;
                    }
                    SVar3 = SzReadNumber32(&local_118,local_78);
                    if (SVar3 != 0) {
                      return SVar3;
                    }
                    if (0x40 < (uint)local_c8[0]) {
                      return 4;
                    }
                    uVar18 = (uint)local_c8[0];
                    if (local_78[0] != 1) {
                      return 4;
                    }
                  }
                  if (0x1f < bVar21) {
                    SVar3 = SzReadNumber32(&local_118,local_78);
                    if (SVar3 != 0) {
                      return SVar3;
                    }
                    uVar10 = (ulong)local_78[0];
                    bVar27 = local_118.Size < uVar10;
                    local_118.Size = local_118.Size - uVar10;
                    if (bVar27) {
                      return 0x10;
                    }
                    local_118.Data = local_118.Data + uVar10;
                  }
                  uVar22 = uVar22 + uVar18;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
                if (uVar22 == 1 && (int)local_100 == 1) {
                  uVar10 = 0;
                  uVar18 = 1;
                }
                else {
                  uVar25 = (int)local_100 - 1;
                  uVar18 = uVar22 - uVar25;
                  if (uVar22 < uVar25) {
                    return 0x10;
                  }
                  if (0x40 < uVar22) {
                    return 4;
                  }
                  if (uVar22 != 0) {
                    memset(local_c8,0,(ulong)uVar22);
                  }
                  memset(local_78,0,(size_t)local_100);
                  if (uVar25 != 0) {
                    uVar25 = 1;
                    do {
                      SVar3 = SzReadNumber32(&local_118,&local_f0);
                      if (SVar3 != 0) {
                        return SVar3;
                      }
                      if (uVar22 <= local_f0) {
                        return 0x10;
                      }
                      if (*(char *)((long)local_c8 + (ulong)local_f0) != '\0') {
                        return 0x10;
                      }
                      *(undefined1 *)((long)local_c8 + (ulong)local_f0) = 1;
                      SVar3 = SzReadNumber32(&local_118,&local_f0);
                      if (SVar3 != 0) {
                        return SVar3;
                      }
                      if ((uint)local_100 <= local_f0) {
                        return 0x10;
                      }
                      cVar2 = *(char *)((long)local_78 + (ulong)local_f0);
                      *(char *)((long)local_78 + (ulong)local_f0) = cVar2 + (cVar2 == '\0');
                      if (cVar2 != '\0') {
                        return 0x10;
                      }
                      uVar25 = uVar25 + 1;
                    } while ((uint)local_100 != uVar25);
                  }
                  uVar25 = uVar18;
                  if (1 < uVar18) {
                    do {
                      SVar3 = SzReadNumber32(&local_118,&local_f0);
                      if (SVar3 != 0) {
                        return SVar3;
                      }
                      if (uVar22 <= local_f0) {
                        return 0x10;
                      }
                      cVar2 = *(char *)((long)local_c8 + (ulong)local_f0);
                      *(char *)((long)local_c8 + (ulong)local_f0) = cVar2 + (cVar2 == '\0');
                      if (cVar2 != '\0') {
                        return 0x10;
                      }
                      uVar25 = uVar25 - 1;
                    } while (uVar25 != 0);
                  }
                  uVar10 = 0;
                  while (*(char *)((long)local_78 + uVar10) != '\0') {
                    uVar10 = uVar10 + 1;
                    if (local_100 == (CSzData *)uVar10) {
                      return 0x10;
                    }
                  }
                  if ((uint)local_100 == (int)uVar10) {
                    return 0x10;
                  }
                }
                p->FoStartPackStreamIndex[(long)local_d0] = local_ec;
                p->FoToCoderUnpackSizes[(long)local_d0] = local_dc;
                p->FoToMainUnpackSizeIndex[(long)local_d0] = (Byte)uVar10;
                uVar25 = local_dc + (uint)local_100;
                if (CARRY4(local_dc,(uint)local_100)) {
                  return 4;
                }
                if (p->NumPackStreams - local_ec < uVar18) {
                  return 0x10;
                }
                local_ec = local_ec + uVar18;
                pCVar13 = (CSzData *)((long)&local_d0->Data + 1);
                pCVar20 = local_f8;
                pbVar12 = local_80;
                local_dc = uVar25;
                UVar23 = local_ec;
              } while (pCVar13 != local_f8);
            }
            p->FoToCoderUnpackSizes[(long)pCVar20] = uVar25;
            __n = (_func_void_ptr_void_ptr_size_t *)(local_118.Data + -(long)pbVar12);
            p->FoStartPackStreamIndex[(long)pCVar20] = UVar23;
            alloc_00 = (CSzAr *)p->FoCodersOffsets;
            *(_func_void_ptr_void_ptr_size_t **)((long)&alloc_00->NumPackStreams + pCVar20 * 8) =
                 __n;
            if (local_118.Data == pbVar12) {
              pCVar24 = (CSzAr *)0x0;
            }
            else {
              pBVar9 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)__n);
              p->CodersData = pBVar9;
              if (pBVar9 == (Byte *)0x0) {
                return 2;
              }
              alloc_00 = p;
              memcpy(pBVar9,pbVar12,(size_t)__n);
              pCVar24 = p;
            }
            if (BVar1 != '\0') {
              if (local_118.Size != 0) {
                return 0x10;
              }
              local_118.Data = sd->Data;
              local_118.Size = sd->Size;
            }
            SVar3 = WaitId(&local_118,0xc);
            if (SVar3 != 0) {
              return SVar3;
            }
            if (uVar25 == 0) {
              pCVar24->CoderUnpackSizes = (UInt64 *)0x0;
            }
            else {
              pUVar6 = (UInt64 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)uVar25 << 3);
              pCVar24->CoderUnpackSizes = pUVar6;
              if (pUVar6 == (UInt64 *)0x0) {
                return 2;
              }
              sVar17 = 0;
              do {
                SVar3 = ReadNumber(&local_118,(UInt64 *)((long)pCVar24->CoderUnpackSizes + sVar17));
                if (SVar3 != 0) {
                  return SVar3;
                }
                sVar17 = sVar17 + 8;
              } while ((ulong)uVar25 << 3 != sVar17);
            }
            SVar3 = ReadNumber(&local_118,local_c8);
            if (SVar3 != 0) {
              return SVar3;
            }
            do {
              if (local_c8[0] == 10) {
                iVar4 = ReadBitUi32s(&local_118,local_d4,&pCVar24->FolderCRCs,(ISzAlloc *)alloc_00);
              }
              else {
                if (local_c8[0] == 0) {
                  sd->Data = local_118.Data;
                  sd->Size = local_118.Size;
                  SVar3 = ReadNumber(sd,&local_e8);
                  if (SVar3 != 0) {
                    return SVar3;
                  }
                  goto LAB_0010f4b3;
                }
                iVar4 = SkipData(&local_118);
              }
              if (iVar4 != 0) {
                return iVar4;
              }
              SVar3 = ReadNumber(&local_118,local_c8);
              if (SVar3 != 0) {
                return SVar3;
              }
            } while( true );
          }
        }
      }
    }
  }
  return 2;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    /* ssi->NumSubDigests = 0; */
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}